

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateCache::AddAlternateTemplateRootDirectoryHelper
          (TemplateCache *this,string *directory,bool clear_template_search_path)

{
  char *pcVar1;
  ostream *poVar2;
  int *piVar3;
  bool bVar4;
  WriterMutexLock local_c8;
  WriterMutexLock ml_1;
  string local_b8 [32];
  ctemplate local_98 [32];
  char *local_78;
  char *cwd;
  char *cwdbuf;
  string local_58 [8];
  string normalized;
  ReaderMutexLock local_30;
  ReaderMutexLock ml;
  bool clear_template_search_path_local;
  string *directory_local;
  TemplateCache *this_local;
  
  ml.mu_._7_1_ = clear_template_search_path;
  ReaderMutexLock::ReaderMutexLock(&local_30,this->mutex_);
  bVar4 = (this->is_frozen_ & 1U) == 0;
  if (!bVar4) {
    this_local._7_1_ = 0;
  }
  ReaderMutexLock::~ReaderMutexLock(&local_30);
  if (bVar4) {
    std::__cxx11::string::string(local_58,(string *)directory);
    NormalizeDirectory((string *)local_58);
    bVar4 = IsAbspath((string *)local_58);
    if (!bVar4) {
      cwd = (char *)operator_new__(0x1000);
      pcVar1 = getcwd(cwd,0x1000);
      local_78 = pcVar1;
      if (pcVar1 == (char *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: [");
        piVar3 = __errno_location();
        pcVar1 = strerror(*piVar3);
        poVar2 = std::operator<<(poVar2,pcVar1);
        poVar2 = std::operator<<(poVar2,"] ");
        poVar2 = std::operator<<(poVar2,"Unable to convert \'");
        poVar2 = std::operator<<(poVar2,local_58);
        poVar2 = std::operator<<(poVar2,"\' to an absolute path, with cwd=");
        std::operator<<(poVar2,cwd);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,pcVar1,(allocator *)((long)&ml_1.mu_ + 7));
        PathJoin(local_98,(string *)local_b8,(string *)local_58);
        std::__cxx11::string::operator=(local_58,(string *)local_98);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&ml_1.mu_ + 7));
      }
      if (cwd != (char *)0x0) {
        operator_delete__(cwd);
      }
    }
    if (1 < kVerbosity) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"V2: ");
      poVar2 = std::operator<<(poVar2,"Setting Template directory to ");
      poVar2 = std::operator<<(poVar2,local_58);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    WriterMutexLock::WriterMutexLock(&local_c8,this->search_path_mutex_);
    if ((ml.mu_._7_1_ & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->search_path_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->search_path_,(value_type *)local_58);
    WriterMutexLock::~WriterMutexLock(&local_c8);
    ReloadAllIfChanged(this,LAZY_RELOAD);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string(local_58);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TemplateCache::AddAlternateTemplateRootDirectoryHelper(
    const string& directory,
    bool clear_template_search_path) {
  {
    ReaderMutexLock ml(mutex_);
    if (is_frozen_) {  // Cannot set root-directory on a frozen cache.
      return false;
    }
  }
  string normalized = directory;
  // make sure it ends with '/'
  NormalizeDirectory(&normalized);
  // Make the directory absolute if it isn't already.  This makes code
  // safer if client later does a chdir.
  if (!IsAbspath(normalized)) {
    char* cwdbuf = new char[PATH_MAX];   // new to avoid stack overflow
    const char* cwd = getcwd(cwdbuf, PATH_MAX);
    if (!cwd) {   // probably not possible, but best to be defensive
      PLOG(WARNING) << "Unable to convert '" << normalized
                    << "' to an absolute path, with cwd=" << cwdbuf;
    } else {
      normalized = PathJoin(cwd, normalized);
    }
    delete[] cwdbuf;
  }

  VLOG(2) << "Setting Template directory to " << normalized << endl;
  {
    WriterMutexLock ml(search_path_mutex_);
    if (clear_template_search_path) {
      search_path_.clear();
    }
    search_path_.push_back(normalized);
  }

  // NOTE(williasr): The template root is not part of the template
  // cache key, so we need to invalidate the cache contents.
  ReloadAllIfChanged(LAZY_RELOAD);
  return true;
}